

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcolb.c
# Opt level: O0

int ffpgpb(fitsfile *fptr,long group,long firstelem,long nelem,uchar *array,int *status)

{
  int *in_R9;
  long row;
  uchar *in_stack_00007250;
  LONGLONG in_stack_00007258;
  LONGLONG in_stack_00007260;
  LONGLONG in_stack_00007268;
  int in_stack_00007274;
  fitsfile *in_stack_00007278;
  int *in_stack_000072c0;
  
  ffpclb(in_stack_00007278,in_stack_00007274,in_stack_00007268,in_stack_00007260,in_stack_00007258,
         in_stack_00007250,in_stack_000072c0);
  return *in_R9;
}

Assistant:

int ffpgpb( fitsfile *fptr,   /* I - FITS file pointer                      */
            long  group,      /* I - group to write(1 = 1st group)          */
            long  firstelem,  /* I - first vector element to write(1 = 1st) */
            long  nelem,      /* I - number of values to write              */
            unsigned char *array, /* I - array of values that are written   */
            int  *status)     /* IO - error status                          */
/*
  Write an array of group parameters to the primary array. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being written).
*/
{
    long row;

    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */

    row=maxvalue(1,group);

    ffpclb(fptr, 1L, row, firstelem, nelem, array, status);
    return(*status);
}